

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::ReadColor(ON_BinaryArchive *this,ON_4fColor *color)

{
  bool bVar1;
  float f;
  float local_1c;
  
  local_1c = 0.0;
  bVar1 = ReadFloat(this,&local_1c);
  if (bVar1) {
    ON_4fColor::SetRed(color,local_1c);
    bVar1 = ReadFloat(this,&local_1c);
    if (bVar1) {
      ON_4fColor::SetGreen(color,local_1c);
      bVar1 = ReadFloat(this,&local_1c);
      if (bVar1) {
        ON_4fColor::SetBlue(color,local_1c);
        bVar1 = ReadFloat(this,&local_1c);
        if (bVar1) {
          ON_4fColor::SetAlpha(color,local_1c);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool
ON_BinaryArchive::ReadColor(ON_4fColor& color)
{
  float f = 0.f;

  bool rc = ReadFloat(&f);
  if (rc)
  {
    color.SetRed(f);
    rc = ReadFloat(&f);
  }
  if (rc)
  {
    color.SetGreen(f);
    rc = ReadFloat(&f);
  }
  if (rc)
  {
    color.SetBlue(f);
    rc = ReadFloat(&f);
  }
  if (rc)
  {
    color.SetAlpha(f);
  }
  return rc;
}